

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pcVar5;
  IColourImpl *pIVar6;
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  columns;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  char local_f8 [8];
  char local_f0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  SummaryColumn local_c8;
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  local_88;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_60 [8];
  char local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((totals->testCases).failed + (totals->testCases).passed + (totals->testCases).failedButOk == 0
     ) {
    poVar2 = (this->super_StreamingReporterBase).stream;
    local_108 = (undefined1  [8])((ulong)(uint7)local_108._1_7_ << 8);
    pIVar6 = Colour::impl();
    (**(code **)(*(long *)pIVar6 + 0x10))(pIVar6,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"No tests ran\n",0xd);
    Colour::~Colour((Colour *)local_108);
  }
  else {
    sVar3 = (totals->assertions).failed;
    sVar4 = (totals->assertions).failedButOk;
    if ((sVar4 == 0 && sVar3 == 0) && (totals->assertions).passed + sVar3 + sVar4 != 0) {
      poVar2 = (this->super_StreamingReporterBase).stream;
      local_108 = (undefined1  [8])((ulong)(uint7)local_108._1_7_ << 8);
      pIVar6 = Colour::impl();
      (**(code **)(*(long *)pIVar6 + 0x10))(pIVar6,0x13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"All tests passed",0x10);
      Colour::~Colour((Colour *)local_108);
      poVar2 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
      pcVar5 = (pointer)(totals->assertions).passed;
      paVar1 = &local_c8.label.field_2;
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"assertion","");
      local_108 = (undefined1  [8])pcVar5;
      local_100._M_p = local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_c8.label._M_dataplus._M_p,
                 local_c8.label._M_dataplus._M_p + local_c8.label._M_string_length);
      operator<<(poVar2,(pluralise *)local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," in ",4);
      pcVar5 = (pointer)(totals->testCases).passed;
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"test case","");
      local_70 = (undefined1  [8])pcVar5;
      local_68._M_p = local_58;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_128,local_128 + local_120)
      ;
      operator<<(poVar2,(pluralise *)local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if (local_68._M_p != local_58) {
        operator_delete(local_68._M_p);
      }
      if (local_128 != local_118) {
        operator_delete(local_128);
      }
      if (local_100._M_p != local_f0) {
        operator_delete(local_100._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
      }
    }
    else {
      local_88.
      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
      paVar1 = &local_c8.label.field_2;
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_128,local_128 + local_120)
      ;
      local_c8.colour = None;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SummaryColumn::addRow
                ((SummaryColumn *)local_70,&local_c8,
                 (totals->testCases).failed + (totals->testCases).passed +
                 (totals->testCases).failedButOk);
      SummaryColumn::addRow
                ((SummaryColumn *)local_108,(SummaryColumn *)local_70,
                 (totals->assertions).failed + (totals->assertions).passed +
                 (totals->assertions).failedButOk);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&local_88,(SummaryColumn *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_70 != (undefined1  [8])local_60) {
        operator_delete((void *)local_70);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.rows);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
      }
      if (local_128 != local_118) {
        operator_delete(local_128);
      }
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"passed","");
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_128,local_128 + local_120)
      ;
      local_c8.colour = Green;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SummaryColumn::addRow((SummaryColumn *)local_70,&local_c8,(totals->testCases).passed);
      SummaryColumn::addRow
                ((SummaryColumn *)local_108,(SummaryColumn *)local_70,(totals->assertions).passed);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&local_88,(SummaryColumn *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_70 != (undefined1  [8])local_60) {
        operator_delete((void *)local_70);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.rows);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
      }
      if (local_128 != local_118) {
        operator_delete(local_128);
      }
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"failed","");
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_128,local_128 + local_120)
      ;
      local_c8.colour = BrightRed;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SummaryColumn::addRow((SummaryColumn *)local_70,&local_c8,(totals->testCases).failed);
      SummaryColumn::addRow
                ((SummaryColumn *)local_108,(SummaryColumn *)local_70,(totals->assertions).failed);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&local_88,(SummaryColumn *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_70 != (undefined1  [8])local_60) {
        operator_delete((void *)local_70);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.rows);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
      }
      if (local_128 != local_118) {
        operator_delete(local_128);
      }
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"failed as expected","");
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_128,local_128 + local_120)
      ;
      local_c8.colour = ReconstructedExpression;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.rows.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SummaryColumn::addRow((SummaryColumn *)local_70,&local_c8,(totals->testCases).failedButOk);
      SummaryColumn::addRow
                ((SummaryColumn *)local_108,(SummaryColumn *)local_70,
                 (totals->assertions).failedButOk);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::emplace_back<Catch::ConsoleReporter::SummaryColumn>(&local_88,(SummaryColumn *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_70 != (undefined1  [8])local_60) {
        operator_delete((void *)local_70);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.rows);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
      }
      if (local_128 != local_118) {
        operator_delete(local_128);
      }
      local_108 = (undefined1  [8])local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"test cases","");
      printSummaryRow(this,(string *)local_108,&local_88,0);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108);
      }
      local_108 = (undefined1  [8])local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"assertions","");
      printSummaryRow(this,(string *)local_108,&local_88,1);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108);
      }
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::~vector(&local_88);
    }
  }
  return;
}

Assistant:

void printTotals( Totals const& totals ) {
            if( totals.testCases.total() == 0 ) {
                stream << Colour( Colour::Warning ) << "No tests ran\n";
            }
            else if( totals.assertions.total() > 0 && totals.assertions.allPassed() ) {
                stream << Colour( Colour::ResultSuccess ) << "All tests passed";
                stream << " ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")"
                        << "\n";
            }
            else {

                std::vector<SummaryColumn> columns;
                columns.push_back( SummaryColumn( "", Colour::None )
                                        .addRow( totals.testCases.total() )
                                        .addRow( totals.assertions.total() ) );
                columns.push_back( SummaryColumn( "passed", Colour::Success )
                                        .addRow( totals.testCases.passed )
                                        .addRow( totals.assertions.passed ) );
                columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                                        .addRow( totals.testCases.failed )
                                        .addRow( totals.assertions.failed ) );
                columns.push_back( SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                                        .addRow( totals.testCases.failedButOk )
                                        .addRow( totals.assertions.failedButOk ) );

                printSummaryRow( "test cases", columns, 0 );
                printSummaryRow( "assertions", columns, 1 );
            }
        }